

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP32_SHA256.c
# Opt level: O0

uint32_t Hacl_HPKE_Curve51_CP32_SHA256_sealBase
                   (uint8_t *skE,uint8_t *pkR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t plainlen,uint8_t *plain,uint8_t *o_enc,uint8_t *o_ct)

{
  long lVar1;
  Hacl_Impl_HPKE_context_s o_ctx_00;
  __uint64_t i_00;
  uint32_t res10;
  uint64_t s_;
  uint32_t res1;
  uint64_t s1;
  uint8_t *tag;
  uint8_t *cipher;
  uint8_t yi_11;
  uint8_t xi_11;
  uint8_t yi_10;
  uint8_t xi_10;
  uint8_t yi_9;
  uint8_t xi_9;
  uint8_t yi_8;
  uint8_t xi_8;
  uint8_t yi_7;
  uint8_t xi_7;
  uint8_t yi_6;
  uint8_t xi_6;
  uint8_t yi_5;
  uint8_t xi_5;
  uint8_t yi_4;
  uint8_t xi_4;
  uint8_t yi_3;
  uint8_t xi_3;
  uint8_t yi_2;
  uint8_t xi_2;
  uint8_t yi_1;
  uint8_t xi_1;
  uint8_t yi;
  uint8_t xi;
  uint32_t i;
  uint8_t enc [12];
  uint64_t s;
  uint8_t nonce [12];
  uint32_t res;
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t ctx_exporter [32];
  uint8_t local_80 [8];
  uint64_t ctx_seq;
  uint8_t ctx_nonce [12];
  uint8_t ctx_key [32];
  uint8_t *aad_local;
  uint32_t aadlen_local;
  uint8_t *info_local;
  uint32_t infolen_local;
  uint8_t *pkR_local;
  uint8_t *skE_local;
  
  memset(ctx_nonce + 4,0,0x20);
  memset((void *)((long)&ctx_seq + 4),0,0xc);
  local_80[0] = '\0';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[6] = '\0';
  local_80[7] = '\0';
  memset(&o_ctx.ctx_exporter,0,0x20);
  unique0x00004780 = ctx_nonce + 4;
  o_ctx.ctx_key = (uint8_t *)((long)&ctx_seq + 4);
  o_ctx.ctx_nonce = local_80;
  o_ctx.ctx_seq = (uint64_t *)&o_ctx.ctx_exporter;
  o_ctx_00.ctx_nonce = o_ctx.ctx_key;
  o_ctx_00.ctx_key = unique0x00004780;
  o_ctx_00.ctx_seq = (uint64_t *)o_ctx.ctx_nonce;
  o_ctx_00.ctx_exporter = (uint8_t *)o_ctx.ctx_seq;
  nonce._4_4_ = Hacl_HPKE_Curve51_CP32_SHA256_setupBaseS(o_enc,o_ctx_00,skE,pkR,infolen,info);
  if (nonce._4_4_ == 0) {
    memset(&s,0,0xc);
    enc._4_8_ = *(undefined8 *)o_ctx.ctx_nonce;
    memset(&yi_1,0,0xc);
    i_00 = __bswap_64(enc._4_8_);
    store64((uint8_t *)&i,i_00);
    s._0_1_ = yi_1 ^ *o_ctx.ctx_key;
    s._1_1_ = xi_1 ^ o_ctx.ctx_key[1];
    s._2_1_ = yi ^ o_ctx.ctx_key[2];
    s._3_1_ = xi ^ o_ctx.ctx_key[3];
    s._4_1_ = (byte)i ^ o_ctx.ctx_key[4];
    s._5_1_ = i._1_1_ ^ o_ctx.ctx_key[5];
    s._6_1_ = i._2_1_ ^ o_ctx.ctx_key[6];
    s._7_1_ = i._3_1_ ^ o_ctx.ctx_key[7];
    nonce[0] = enc[0] ^ o_ctx.ctx_key[8];
    nonce[1] = enc[1] ^ o_ctx.ctx_key[9];
    nonce[2] = enc[2] ^ o_ctx.ctx_key[10];
    nonce[3] = enc[3] ^ o_ctx.ctx_key[0xb];
    Hacl_AEAD_Chacha20Poly1305_encrypt
              (o_ct,o_ct + plainlen,plain,plainlen,aad,aadlen,stack0xffffffffffffff38,(uint8_t *)&s)
    ;
    lVar1 = *(long *)o_ctx.ctx_nonce;
    if (lVar1 != -1) {
      *(long *)o_ctx.ctx_nonce = lVar1 + 1;
    }
    s_._4_4_ = (uint)(lVar1 == -1);
    skE_local._4_4_ = s_._4_4_;
  }
  else {
    skE_local._4_4_ = 1;
  }
  return skE_local._4_4_;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP32_SHA256_sealBase(
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t plainlen,
  uint8_t *plain,
  uint8_t *o_enc,
  uint8_t *o_ct
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[32U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t res = Hacl_HPKE_Curve51_CP32_SHA256_setupBaseS(o_enc, o_ctx, skE, pkR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = o_ct;
    uint8_t *tag = o_ct + plainlen;
    Hacl_AEAD_Chacha20Poly1305_encrypt(cipher,
      tag,
      plain,
      plainlen,
      aad,
      aadlen,
      o_ctx.ctx_key,
      nonce);
    uint64_t s1 = o_ctx.ctx_seq[0U];
    uint32_t res1;
    if (s1 == 18446744073709551615ULL)
    {
      res1 = 1U;
    }
    else
    {
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      res1 = 0U;
    }
    uint32_t res10 = res1;
    return res10;
  }
  return 1U;
}